

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroStringMapEntriesPopulatedInReflection_Test::TestBody
          (NoFieldPresenceTest_TestNonZeroStringMapEntriesPopulatedInReflection_Test *this)

{
  FieldDescriptor *field;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Message *x;
  pointer *__ptr;
  char *pcVar1;
  string_view name;
  Metadata MVar2;
  Metadata MVar3;
  AssertionResult gtest_ar;
  TestAllMapTypes message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  AssertHelper local_110;
  undefined1 local_108 [8];
  UntypedMapBase *local_100;
  undefined1 local_e8 [216];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_e8,(Arena *)0x0);
  MVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetMetadata
                    ((TestAllMapTypes *)
                     proto2_nofieldpresence_unittest::_TestAllMapTypes_default_instance_);
  MVar3 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetMetadata
                    ((TestAllMapTypes *)
                     proto2_nofieldpresence_unittest::_TestAllMapTypes_default_instance_);
  name._M_str = "map_int32_bytes";
  name._M_len = 0xf;
  field = Descriptor::FindFieldByName(MVar3.descriptor,name);
  this_00 = protobuf::internal::
            TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::MutableMap((TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_e8 + 0x10));
  local_118._M_head_impl._0_4_ = 9;
  Map<int,std::__cxx11::string>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)local_108,this_00,(int *)&local_118);
  std::__cxx11::string::_M_replace
            (CONCAT71(local_108._1_7_,local_108[0]) + 0x10,0,
             *(char **)(CONCAT71(local_108._1_7_,local_108[0]) + 0x18),0x1262809);
  local_118._M_head_impl._0_4_ = 1;
  local_110.data_._0_4_ = Reflection::FieldSize(MVar2.reflection,(Message *)local_e8,field);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_108,"1","r->FieldSize(message, field_map_int32_bytes)",
             (int *)&local_118,(int *)&local_110);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x158,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_100 != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  x = Reflection::GetRepeatedMessage(MVar2.reflection,(Message *)local_e8,field,0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasKeyMatcher>::
  operator()((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasKeyMatcher>
              *)local_108,"bytes_map_entry",x);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x15d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_100 != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasValueMatcher>::
  operator()((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasValueMatcher>
              *)local_108,"bytes_map_entry",x);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x15e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_100 != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::no_presence_map_test_internal::MapEntryListFieldsSizeMatcherP<unsigned_long>>
  ::operator()(local_108,(char *)&local_118,(Message *)"bytes_map_entry");
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x15f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_100 != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_e8);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroStringMapEntriesPopulatedInReflection) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_bytes =
      desc->FindFieldByName("map_int32_bytes");

  // Set nonzero values for key-value pairs and test that.
  (*message.mutable_map_int32_bytes())[9] = "hello";

  // Map entries show up on reflection.
  EXPECT_EQ(1, r->FieldSize(message, field_map_int32_bytes));
  const google::protobuf::Message& bytes_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_bytes, /*index=*/0);

  // HasField for both key and value returns true.
  EXPECT_THAT(bytes_map_entry, MapEntryHasKey());
  EXPECT_THAT(bytes_map_entry, MapEntryHasValue());
  EXPECT_THAT(bytes_map_entry, MapEntryListFieldsSize(2));
}